

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

array * cs_impl::string_cs_ext::split(string *str,array *signals)

{
  bool bVar1;
  any *this;
  char *pcVar2;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  array *in_RDI;
  any *sig;
  const_iterator __end3;
  const_iterator __begin3;
  array *__range3;
  char *ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  bool found;
  string buf;
  array arr;
  _Self *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffff20;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_d8;
  undefined8 local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined8 local_98;
  byte local_89;
  string local_88 [112];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x2424f9);
  std::__cxx11::string::string(local_88);
  local_89 = 0;
  local_98 = local_10;
  local_a0._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffec8);
    if (!bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::deque<cs_impl::any,std::allocator<cs_impl::any>>::emplace_back<std::__cxx11::string&>
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (any *)in_stack_fffffffffffffec8);
      }
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_88);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(in_stack_ffffffffffffff20);
      return in_RDI;
    }
    this = (any *)__gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_a0);
    local_b8 = local_18;
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffec8);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffec8);
    while (bVar1 = std::operator!=((_Self *)CONCAT44(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0),
                                   in_stack_fffffffffffffec8), bVar1) {
      std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::operator*
                (&local_d8);
      in_stack_fffffffffffffed4 = (int)*(char *)&this->mDat;
      pcVar2 = any::const_val<char>(this);
      if (in_stack_fffffffffffffed4 == *pcVar2) {
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::deque<cs_impl::any,std::allocator<cs_impl::any>>::emplace_back<std::__cxx11::string&>
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (any *)in_stack_fffffffffffffec8);
          std::__cxx11::string::clear();
        }
        local_89 = 1;
        break;
      }
      std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::operator++
                ((_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    }
    if ((local_89 & 1) == 0) {
      std::__cxx11::string::push_back((char)local_88);
    }
    else {
      local_89 = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_a0);
  } while( true );
}

Assistant:

array split(const string &str, const array &signals)
		{
			array
			arr;
			string buf;
			bool found = false;
			for (auto &ch: str) {
				for (auto &sig: signals) {
					if (ch == sig.const_val<char>()) {
						if (!buf.empty()) {
							arr.emplace_back(buf);
							buf.clear();
						}
						found = true;
						break;
					}
				}
				if (found)
					found = false;
				else
					buf.push_back(ch);
			}
			if (!buf.empty())
				arr.emplace_back(buf);
			return std::move(arr);
		}